

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O2

void __thiscall
cppcms::impl::cgi::connection::async_prepare_request(connection *this,context *context,ehandler *h)

{
  char cVar1;
  int iVar2;
  level_type lVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_a0;
  intrusive_ptr<booster::callable<void_()>_> local_98;
  context *context_local;
  intrusive_ptr<booster::callable<void_()>_> local_88 [6];
  __shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  error_code e;
  anon_enum_32 local_38 [8];
  
  e._M_value = 0;
  context_local = context;
  e._M_cat = (error_category *)std::_V2::system_category();
  iVar2 = (*this->_vptr_connection[0xe])(this);
  booster::aio::basic_io_device::set_non_blocking(SUB41(iVar2,0),(error_code *)0x1);
  if (e._M_value == 0) {
    std::__shared_ptr<cppcms::impl::cgi::connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::impl::cgi::connection,void>
              (local_58,(__weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> *)
                        &this->super_enable_shared_from_this<cppcms::impl::cgi::connection>);
    mfunc_to_event_handler<cppcms::impl::cgi::connection,std::shared_ptr<cppcms::impl::cgi::connection>,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>const&,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>>
              ((offset_in_connection_to_subr)&local_a0,
               (shared_ptr<cppcms::impl::cgi::connection> *)on_headers_read,(context **)0x0,
               (callback<void_(cppcms::http::context::completion_type)> *)local_58);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)local_88,
               &local_a0);
    (*this->_vptr_connection[0xf])(this,local_88);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)local_88);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  }
  else {
    lVar3 = booster::log::logger::instance();
    cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
    if (cVar1 != '\0') {
      booster::log::message::message
                ((message *)local_88,warning,"cppcms",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/cgi_api.cpp"
                 ,0xba);
      poVar4 = (ostream *)booster::log::message::out();
      poVar4 = std::operator<<(poVar4,"Failed to set nonblocking mode in socket ");
      (**(code **)(*(long *)e._M_cat + 0x20))(local_38,e._M_cat,e._M_value);
      std::operator<<(poVar4,(string *)local_38);
      std::__cxx11::string::~string((string *)local_38);
      booster::log::message::~message((message *)local_88);
    }
    iVar2 = (*this->_vptr_connection[0xc])(this);
    local_38[0] = operation_aborted;
    func_to_handler<booster::callback<void(cppcms::http::context::completion_type)>,cppcms::http::context::completion_type>
              ((impl *)&local_98,h,local_38);
    booster::intrusive_ptr<booster::callable<void_()>_>::intrusive_ptr(local_88,&local_98);
    booster::aio::io_service::post((callback *)CONCAT44(extraout_var,iVar2));
    booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(local_88);
    booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_98);
  }
  return;
}

Assistant:

void connection::async_prepare_request(	http::context *context,
					ehandler const &h)
{
	booster::system::error_code e;
	socket().set_non_blocking(true,e);
	if(e) {
		BOOSTER_WARNING("cppcms") << "Failed to set nonblocking mode in socket " << e.message();
		get_io_service().post(func_to_handler(h,http::context::operation_aborted));
		return;
	}
	async_read_headers(mfunc_to_event_handler(&connection::on_headers_read,self(),context,h));
}